

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_sum(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
             lyxp_set *set,int options)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  lyxp_set_type lVar3;
  lyxp_set *set_00;
  longdouble *__return_storage_ptr__;
  LY_ERR *pLVar4;
  lyd_node *str;
  char *pcVar5;
  uint uVar6;
  lyxp_set *plVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
    free((set->val).nodes);
  }
  set->type = LYXP_SET_NUMBER;
  (set->val).num = (longdouble)0;
  plVar7 = *args;
  lVar3 = plVar7->type;
  switch(lVar3) {
  case LYXP_SET_EMPTY:
    goto switchD_0016e569_caseD_0;
  case LYXP_SET_NODE_SET:
    set_00 = (lyxp_set *)malloc(0x10);
    if (set_00 != (lyxp_set *)0x0) {
      if (plVar7->used != 0) {
        uVar6 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&((plVar7->val).nodes)->node + (ulong)((uVar6 & 0xffff) << 4));
          uVar2 = puVar1[1];
          *(undefined8 *)set_00 = *puVar1;
          *(undefined8 *)&set_00->field_0x8 = uVar2;
          str = cur_node;
          __return_storage_ptr__ =
               (longdouble *)cast_node_set_to_string(set_00,cur_node,param_4,options);
          if (__return_storage_ptr__ == (longdouble *)0x0) goto LAB_0016e640;
          cast_string_to_number(__return_storage_ptr__,(char *)str);
          free(__return_storage_ptr__);
          (set->val).num = in_ST0 + (set->val).num;
          uVar6 = uVar6 + 1;
          plVar7 = *args;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
        } while ((uVar6 & 0xffff) < plVar7->used);
      }
      free(set_00);
      return 0;
    }
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","xpath_sum");
    goto LAB_0016e640;
  case LYXP_SET_SNODE_SET:
    pcVar5 = "schema node set";
    break;
  case LYXP_SET_BOOLEAN:
    pcVar5 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar5 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar5 = "string";
    break;
  default:
    pcVar5 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar5,"sum(node-set)");
LAB_0016e640:
  lVar3 = ~LYXP_SET_EMPTY;
switchD_0016e569_caseD_0:
  return lVar3;
}

Assistant:

static int
xpath_sum(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
          struct lyxp_set *set, int options)
{
    long double num;
    char *str;
    uint16_t i;
    struct lyxp_set set_item;

    set_fill_number(set, 0);
    if (args[0]->type == LYXP_SET_EMPTY) {
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "sum(node-set)");
        return -1;
    }

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = malloc(sizeof *set_item.val.nodes);
    if (!set_item.val.nodes) {
        LOGMEM;
        return -1;
    }

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        str = cast_node_set_to_string(&set_item, cur_node, local_mod, options);
        if (!str) {
            return -1;
        }
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return EXIT_SUCCESS;
}